

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O2

void FuzzingParameterSet::print_dynamic_parameters2
               (bool sync_at_each_ref,int wait_until_hammering_us,int num_aggs_for_sync)

{
  char *args;
  string local_68;
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Printing code jitting-related fuzzing parameters:",
             (allocator<char> *)&local_68);
  Logger::log_info(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"sync_each_ref: %s",&local_21);
  args = "false";
  if (sync_at_each_ref) {
    args = "true";
  }
  format_string<char_const*>(&local_48,&local_68,args);
  Logger::log_data(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"wait_until_start_hammering_refs: %d",&local_21);
  format_string<int>(&local_48,&local_68,wait_until_hammering_us);
  Logger::log_data(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"num_aggressors_for_sync: %d",&local_21);
  format_string<int>(&local_48,&local_68,num_aggs_for_sync);
  Logger::log_data(&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void FuzzingParameterSet::print_dynamic_parameters2(bool sync_at_each_ref,
                                                    int wait_until_hammering_us,
                                                    int num_aggs_for_sync) {
  Logger::log_info("Printing code jitting-related fuzzing parameters:");
  Logger::log_data(format_string("sync_each_ref: %s", (sync_at_each_ref ? "true" : "false")));
  Logger::log_data(format_string("wait_until_start_hammering_refs: %d", wait_until_hammering_us));
  Logger::log_data(format_string("num_aggressors_for_sync: %d", num_aggs_for_sync));
}